

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O0

void __thiscall
MODEL3D::three_dim_model::clipper_paths_to_gds
          (three_dim_model *this,Paths *target_paths,string *gds_name,int *layer_number)

{
  int layer;
  bool bVar1;
  reference in_path;
  pointer corX;
  pointer pcVar2;
  vector<int,_std::allocator<int>_> *corY;
  void *__buf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  gdsSTR local_3c8;
  co_ord *local_2d0;
  gdsBOUNDARY local_2c8;
  __normal_iterator<co_ord_*,_std::vector<co_ord,_std::allocator<co_ord>_>_> local_260;
  iterator polygon_it;
  iterator polygons_it_end;
  undefined1 local_248 [8];
  co_ord p_hold_poly;
  const_iterator path_it;
  const_iterator paths_it_end;
  vector<co_ord,_std::allocator<co_ord>_> polygons;
  undefined1 local_1e0 [8];
  gdsSTR main;
  gdscpp my_polygons;
  int *layer_number_local;
  string *gds_name_local;
  Paths *target_paths_local;
  three_dim_model *this_local;
  
  corY = (vector<int,_std::allocator<int>_> *)layer_number;
  gdscpp::gdscpp((gdscpp *)
                 &main.BOX.super__Vector_base<gdsBOX,_std::allocator<gdsBOX>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  gdsSTR::gdsSTR((gdsSTR *)local_1e0);
  std::__cxx11::string::operator=((string *)local_1e0,(string *)gds_name);
  std::vector<co_ord,_std::allocator<co_ord>_>::vector
            ((vector<co_ord,_std::allocator<co_ord>_> *)&paths_it_end);
  path_it = std::
            vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
            ::end(target_paths);
  p_hold_poly.y.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::
                vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                ::begin(target_paths);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
                        *)&p_hold_poly.y.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,&path_it);
    if (!bVar1) break;
    co_ord::co_ord((co_ord *)local_248);
    in_path = __gnu_cxx::
              __normal_iterator<const_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
              ::operator*((__normal_iterator<const_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
                           *)&p_hold_poly.y.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
    path_to_co_ord(this,in_path,(co_ord *)local_248);
    std::vector<co_ord,_std::allocator<co_ord>_>::push_back
              ((vector<co_ord,_std::allocator<co_ord>_> *)&paths_it_end,(value_type *)local_248);
    co_ord::~co_ord((co_ord *)local_248);
    __gnu_cxx::
    __normal_iterator<const_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
    ::operator++((__normal_iterator<const_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
                  *)&p_hold_poly.y.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,0);
  }
  polygon_it = std::vector<co_ord,_std::allocator<co_ord>_>::end
                         ((vector<co_ord,_std::allocator<co_ord>_> *)&paths_it_end);
  local_260._M_current =
       (co_ord *)
       std::vector<co_ord,_std::allocator<co_ord>_>::begin
                 ((vector<co_ord,_std::allocator<co_ord>_> *)&paths_it_end);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_260,&polygon_it);
    if (!bVar1) break;
    layer = *layer_number;
    corX = __gnu_cxx::__normal_iterator<co_ord_*,_std::vector<co_ord,_std::allocator<co_ord>_>_>::
           operator->(&local_260);
    pcVar2 = __gnu_cxx::__normal_iterator<co_ord_*,_std::vector<co_ord,_std::allocator<co_ord>_>_>::
             operator->(&local_260);
    corY = &pcVar2->y;
    drawBoundary(&local_2c8,layer,&corX->x,corY);
    std::vector<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>::push_back
              ((vector<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_> *)
               &main.last_modified.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_2c8);
    gdsBOUNDARY::~gdsBOUNDARY(&local_2c8);
    local_2d0 = (co_ord *)
                __gnu_cxx::
                __normal_iterator<co_ord_*,_std::vector<co_ord,_std::allocator<co_ord>_>_>::
                operator++(&local_260,0);
  }
  gdsSTR::gdsSTR(&local_3c8,(gdsSTR *)local_1e0);
  gdscpp::setSTR((gdscpp *)
                 &main.BOX.super__Vector_base<gdsBOX,_std::allocator<gdsBOX>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_3c8);
  gdsSTR::~gdsSTR(&local_3c8);
  std::operator+(&local_408,"data/",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0);
  std::operator+(&local_3e8,&local_408,".gds");
  gdscpp::write((gdscpp *)
                &main.BOX.super__Vector_base<gdsBOX,_std::allocator<gdsBOX>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,(int)&local_3e8,__buf,(size_t)corY);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_408);
  std::vector<co_ord,_std::allocator<co_ord>_>::~vector
            ((vector<co_ord,_std::allocator<co_ord>_> *)&paths_it_end);
  gdsSTR::~gdsSTR((gdsSTR *)local_1e0);
  gdscpp::~gdscpp((gdscpp *)
                  &main.BOX.super__Vector_base<gdsBOX,_std::allocator<gdsBOX>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void MODEL3D::three_dim_model::clipper_paths_to_gds(    const ClipperLib::Paths &target_paths,
                                                        const std::string &gds_name,
                                                        const int &layer_number )
{
    gdscpp my_polygons;
    gdsSTR main;
    main.name = gds_name;
    std::vector<co_ord> polygons;
    auto paths_it_end = target_paths.end();
    for (auto path_it = target_paths.begin(); path_it != paths_it_end; path_it++)
    {
        co_ord p_hold_poly;
        path_to_co_ord(*path_it, p_hold_poly);
        polygons.push_back(p_hold_poly);
    }
    auto polygons_it_end = polygons.end();
    for (auto polygon_it = polygons.begin(); polygon_it != polygons_it_end; polygon_it++)
    {
        main.BOUNDARY.push_back(drawBoundary( layer_number , polygon_it->x, polygon_it->y));
    }
    my_polygons.setSTR(main);
    my_polygons.write("data/"+main.name+".gds");
}